

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  float *pfVar1;
  pointer pcVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  uchar *puVar6;
  uchar *puVar7;
  bool bVar8;
  pointer pLVar9;
  pointer pLVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  char *pcVar14;
  size_t sVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int unaff_EBP;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  pointer pLVar25;
  EXRTile *pEVar26;
  int *piVar27;
  long lVar28;
  float fVar29;
  EXRImage exr_image;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  string ch_name;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  long local_370;
  int local_368;
  int local_360;
  int local_340;
  EXRImage local_338;
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> local_318;
  long local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  EXRTile *local_298;
  long local_290;
  int *local_288;
  long local_280;
  int *local_278;
  EXRVersion local_26c;
  EXRHeader local_258;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  ostream local_1c0 [8];
  char local_1b8 [104];
  ios_base local_150 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (out_rgba == (float **)0x0) {
    local_1d0 = (undefined1  [8])local_1c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"Invalid argument for LoadEXR()","");
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_1d0);
      *err = pcVar14;
    }
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    return -3;
  }
  local_278 = width;
  memset(&local_258,0,0x88);
  local_338.tiles = (EXRTile *)0x0;
  local_338.images = (uchar **)0x0;
  local_338.width = 0;
  local_338.height = 0;
  local_338.num_channels = 0;
  local_338.num_tiles = 0;
  iVar11 = ParseEXRVersionFromFile(&local_26c,filename);
  if (iVar11 == 0) {
    if (local_26c.non_image != 0 || local_26c.multipart != 0) {
      local_1d0 = (undefined1  [8])local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,
                 "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
      if (err != (char **)0x0) {
        pcVar14 = strdup((char *)local_1d0);
        *err = pcVar14;
      }
      if (local_1d0 != (undefined1  [8])local_1c0) {
        operator_delete((void *)local_1d0);
      }
      iVar11 = -4;
      goto LAB_0016a29d;
    }
    bVar8 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1c0,"Failed to open EXR file or read version info from EXR file. code(",0x41);
    poVar13 = (ostream *)std::ostream::operator<<(local_1c0,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar14 = strdup(local_2f8._M_dataplus._M_p);
      *err = pcVar14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
    std::ios_base::~ios_base(local_150);
LAB_0016a29d:
    bVar8 = false;
    unaff_EBP = iVar11;
  }
  if (!bVar8) {
    return unaff_EBP;
  }
  iVar11 = ParseEXRHeaderFromFile(&local_258,&local_26c,filename,err);
  if (iVar11 != 0) {
    FreeEXRHeader(&local_258);
    return iVar11;
  }
  if (0 < local_258.num_channels) {
    lVar19 = 0;
    do {
      if (local_258.pixel_types[lVar19] == 1) {
        local_258.requested_pixel_types[lVar19] = 2;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_258.num_channels);
  }
  iVar11 = LoadEXRImageFromFile(&local_338,&local_258,filename,err);
  if (iVar11 != 0) {
    FreeEXRHeader(&local_258);
    return iVar11;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tinyexr::GetLayers(&local_258,&local_48);
  local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8 = local_2c8;
  local_288 = height;
  if (layername == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  }
  else {
    sVar15 = strlen(layername);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,layername,layername + sVar15);
  }
  pLVar10 = local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pLVar9 = local_318.
           super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar25 = local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar2 = (pLVar25->name)._M_dataplus._M_p;
      if (&(pLVar25->name).field_2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2) {
        operator_delete(pcVar2);
      }
      pLVar25 = pLVar25 + 1;
    } while (pLVar25 != pLVar10);
    local_318.super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar9;
  }
  if (0 < local_258.num_channels) {
    lVar19 = 0;
    poVar13 = (ostream *)0x0;
    do {
      std::__cxx11::string::string
                ((string *)&local_2f8,(local_258.channels)->name + lVar19,(allocator *)local_1d0);
      if (local_2d0 == 0) {
        uVar21 = std::__cxx11::string::rfind((char)&local_2f8,0x2e);
        if ((uVar21 != 0xffffffffffffffff) && (uVar21 < local_2f8._M_string_length)) {
          std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_2f8);
LAB_0016a53d:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0)
          ;
          if (local_1d0 != (undefined1  [8])local_1c0) {
            operator_delete((void *)local_1d0);
          }
        }
LAB_0016a562:
        local_2b8 = local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_2f8._M_dataplus._M_p,
                   local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
        local_1c8._M_p = local_1b8;
        local_1d0 = (undefined1  [8])poVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_2b8,local_2b8 + local_2b0);
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8);
        }
        std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::push_back
                  (&local_318,(value_type *)local_1d0);
        if (local_1c8._M_p != local_1b8) {
          operator_delete(local_1c8._M_p);
        }
      }
      else {
        local_1d0 = (undefined1  [8])local_1c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d0,local_2d8,local_2d8 + local_2d0);
        std::__cxx11::string::_M_replace_aux((ulong)local_1d0,(ulong)local_1c8._M_p,0,'\x01');
        lVar16 = std::__cxx11::string::find((char *)&local_2f8,(ulong)local_1d0,0);
        if (local_1d0 != (undefined1  [8])local_1c0) {
          operator_delete((void *)local_1d0);
        }
        if (lVar16 != -1) {
          if (lVar16 == 0) {
            std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_2f8);
            goto LAB_0016a53d;
          }
          goto LAB_0016a562;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      poVar13 = poVar13 + 1;
      lVar19 = lVar19 + 0x110;
    } while ((long)poVar13 < (long)local_258.num_channels);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if ((long)local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_1d0 = (undefined1  [8])local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Layer Not Found","");
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_1d0);
      *err = pcVar14;
    }
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    iVar11 = -0xd;
    goto LAB_0016ac17;
  }
  uVar18 = ((long)local_318.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_318.
                  super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  uVar21 = 4;
  if (uVar18 < 4) {
    uVar21 = uVar18;
  }
  iVar11 = -1;
  lVar19 = 0;
  local_360 = -1;
  local_340 = -1;
  local_368 = -1;
  do {
    pcVar14 = (char *)((long)&((local_318.
                                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar19);
    piVar27 = (int *)((long)&(local_318.
                              super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->index + lVar19);
    iVar12 = std::__cxx11::string::compare(pcVar14);
    if (iVar12 == 0) {
      iVar11 = *piVar27;
    }
    else {
      iVar12 = std::__cxx11::string::compare(pcVar14);
      if (iVar12 == 0) {
        local_360 = *piVar27;
      }
      else {
        iVar12 = std::__cxx11::string::compare(pcVar14);
        if (iVar12 == 0) {
          local_340 = *piVar27;
        }
        else {
          iVar12 = std::__cxx11::string::compare(pcVar14);
          if (iVar12 == 0) {
            local_368 = *piVar27;
          }
        }
      }
    }
    lVar19 = lVar19 + 0x28;
  } while ((uVar21 + (uVar21 == 0)) * 0x28 != lVar19);
  iVar12 = local_338.width;
  iVar22 = local_338.height;
  if ((long)local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_318.
            super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x28) {
    sVar3 = (local_318.
             super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
             _M_impl.super__Vector_impl_data._M_start)->index;
    lVar19 = (long)local_338.width;
    pfVar17 = (float *)malloc(lVar19 * local_338.height * 0x10);
    *out_rgba = pfVar17;
    iVar11 = (int)sVar3;
    if (local_258.tiled == 0) {
      uVar20 = iVar12 * iVar22;
      if (0 < (int)uVar20) {
        puVar4 = local_338.images[iVar11];
        lVar19 = 0;
        do {
          fVar29 = *(float *)(puVar4 + lVar19);
          pfVar1 = pfVar17 + lVar19;
          *pfVar1 = fVar29;
          pfVar1[1] = fVar29;
          pfVar1[2] = fVar29;
          pfVar1[3] = fVar29;
          lVar19 = lVar19 + 4;
        } while ((ulong)uVar20 << 2 != lVar19);
      }
    }
    else if (0 < (long)local_338.num_tiles) {
      local_370 = 0;
      do {
        if (0 < local_258.tile_size_y) {
          pEVar26 = local_338.tiles + local_370;
          lVar16 = 0;
          uVar21 = 0;
          do {
            if (0 < local_258.tile_size_x) {
              lVar24 = (long)pEVar26->offset_x * (long)local_258.tile_size_x;
              iVar22 = pEVar26->offset_y * local_258.tile_size_y;
              lVar28 = (iVar22 + (int)uVar21) * iVar12 + lVar24;
              lVar23 = 0;
              do {
                if ((lVar24 < lVar19) && (iVar22 + (int)uVar21 < local_338.height)) {
                  puVar4 = pEVar26->images[iVar11];
                  pfVar17[lVar28 * 4 + lVar23] = *(float *)(puVar4 + lVar23 + lVar16);
                  pfVar17[lVar28 * 4 + lVar23 + 1] = *(float *)(puVar4 + lVar23 + lVar16);
                  pfVar17[lVar28 * 4 + lVar23 + 2] = *(float *)(puVar4 + lVar23 + lVar16);
                  pfVar17[lVar28 * 4 + lVar23 + 3] = *(float *)(puVar4 + lVar23 + lVar16);
                }
                lVar23 = lVar23 + 4;
                lVar24 = lVar24 + 1;
              } while ((ulong)(uint)local_258.tile_size_x << 2 != lVar23);
            }
            uVar21 = uVar21 + 1;
            lVar16 = lVar16 + (long)local_258.tile_size_x * 4;
          } while (uVar21 != (uint)local_258.tile_size_y);
        }
        local_370 = local_370 + 1;
      } while (local_370 != local_338.num_tiles);
    }
LAB_0016ab4f:
    *local_278 = local_338.width;
    *local_288 = local_338.height;
    iVar11 = 0;
  }
  else {
    if (iVar11 == -1) {
      local_1d0 = (undefined1  [8])local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"R channel not found","");
    }
    else if (local_360 == -1) {
      local_1d0 = (undefined1  [8])local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"G channel not found","");
    }
    else {
      if (local_340 != -1) {
        lVar19 = (long)local_338.width;
        pfVar17 = (float *)malloc(lVar19 * local_338.height * 0x10);
        *out_rgba = pfVar17;
        if (local_258.tiled == 0) {
          uVar20 = iVar12 * iVar22;
          if (0 < (int)uVar20) {
            puVar4 = local_338.images[iVar11];
            puVar6 = local_338.images[local_360];
            puVar7 = local_338.images[local_340];
            lVar19 = 0;
            do {
              pfVar17[lVar19] = *(float *)(puVar4 + lVar19);
              pfVar17[lVar19 + 1] = *(float *)(puVar6 + lVar19);
              pfVar17[lVar19 + 2] = *(float *)(puVar7 + lVar19);
              fVar29 = 1.0;
              if (local_368 != -1) {
                fVar29 = *(float *)(local_338.images[local_368] + lVar19);
              }
              pfVar17[lVar19 + 3] = fVar29;
              lVar19 = lVar19 + 4;
            } while ((ulong)uVar20 << 2 != lVar19);
          }
        }
        else {
          local_290 = (long)local_338.num_tiles;
          if (0 < local_290) {
            local_280 = (long)local_258.tile_size_x;
            local_298 = local_338.tiles;
            local_300 = 0;
            do {
              if (0 < local_258.tile_size_y) {
                pEVar26 = local_338.tiles + local_300;
                local_370 = 0;
                uVar21 = 0;
                do {
                  if (0 < local_258.tile_size_x) {
                    lVar23 = pEVar26->offset_x * local_280;
                    iVar22 = pEVar26->offset_y * local_258.tile_size_y;
                    lVar28 = (iVar22 + (int)uVar21) * iVar12 + lVar23;
                    lVar24 = 0;
                    lVar16 = local_370;
                    do {
                      if ((lVar23 < lVar19) && (iVar22 + (int)uVar21 < local_338.height)) {
                        ppuVar5 = pEVar26->images;
                        pfVar17[lVar28 * 4 + lVar24] = *(float *)(ppuVar5[iVar11] + lVar16);
                        pfVar17[lVar28 * 4 + lVar24 + 1] = *(float *)(ppuVar5[local_360] + lVar16);
                        pfVar17[lVar28 * 4 + lVar24 + 2] = *(float *)(ppuVar5[local_340] + lVar16);
                        fVar29 = 1.0;
                        if (local_368 != -1) {
                          fVar29 = *(float *)(ppuVar5[local_368] + lVar16);
                        }
                        pfVar17[lVar28 * 4 + lVar24 + 3] = fVar29;
                      }
                      lVar16 = lVar16 + 4;
                      lVar24 = lVar24 + 4;
                      lVar23 = lVar23 + 1;
                    } while ((ulong)(uint)local_258.tile_size_x << 2 != lVar24);
                  }
                  uVar21 = uVar21 + 1;
                  local_370 = local_370 + local_280 * 4;
                } while (uVar21 != (uint)local_258.tile_size_y);
              }
              local_300 = local_300 + 1;
            } while (local_300 != local_290);
          }
        }
        goto LAB_0016ab4f;
      }
      local_1d0 = (undefined1  [8])local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"B channel not found","");
    }
    if (err != (char **)0x0) {
      pcVar14 = strdup((char *)local_1d0);
      *err = pcVar14;
    }
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    iVar11 = -4;
  }
LAB_0016ac17:
  FreeEXRHeader(&local_258);
  FreeEXRImage(&local_338);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector(&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return iVar11;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);

  if (channels.size() < 1) {
    tinyexr::SetErrorMessage("Layer Not Found", err);
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii = exr_image.tiles[it].offset_x *
                               static_cast<int>(exr_header.tile_size_x) +
                           i;
            const int jj = exr_image.tiles[it].offset_y *
                               static_cast<int>(exr_header.tile_size_y) +
                           j;
            const int idx = ii + jj * static_cast<int>(exr_image.width);

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}